

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O2

void TestLength<signed_char,int>(char *length_spec,int value)

{
  uint *puVar1;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  uint uVar2;
  char **in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char *pcVar5;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  int value_local;
  string_view local_1e8;
  char *length_spec_local;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  ostringstream os;
  string local_188 [16];
  uint auStack_178 [88];
  char **ppcVar4;
  
  value_local = value;
  length_spec_local = length_spec;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::ostream::_M_insert<long_long>((longlong)&os);
  std::__cxx11::stringbuf::str();
  fmt::v5::format<char[5],char_const*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8,
             (v5 *)0x197d1c,(char (*) [5])&length_spec_local,in_RCX);
  test_sprintf<int>(&local_230,local_1e8,&value_local);
  pbVar3 = &local_210;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"os.str()",
             "test_sprintf(fmt::format(\"%{}d\", length_spec), value)",pbVar3,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_210);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_230);
    std::operator<<((ostream *)(local_230._M_dataplus._M_p + 0x10),"format: ");
    fmt::v5::format<char[5],char_const*>
              (&local_210,(v5 *)0x197d1c,(char (*) [5])&length_spec_local,(char **)pbVar3);
    std::operator<<((ostream *)(local_230._M_dataplus._M_p + 0x10),(string *)&local_210);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x142;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x142,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_210);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_230);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::stringbuf::str();
  fmt::v5::format<char[5],char_const*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)0x197d1c,(char (*) [5])&length_spec_local,(char **)pbVar3);
  format.data_._1_7_ = gtest_ar._1_7_;
  format.data_._0_1_ = gtest_ar.success_;
  format.size_ = (size_t)gtest_ar.message_.ptr_;
  make_positional_abi_cxx11_((string *)&local_1e8,format);
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_230,(v5 *)&local_1e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_local,
             (int *)pbVar3);
  pbVar3 = &local_210;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_1,"os.str()",
             "fmt::sprintf(make_positional(fmt::format(\"%{}d\", length_spec)), value)",pbVar3,
             &local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_210);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_210);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x142;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x142,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_230,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_230);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_210);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__cxx11::stringbuf::str();
  fmt::v5::format<char[5],char_const*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8,
             (v5 *)"%{}i",(char (*) [5])&length_spec_local,(char **)pbVar3);
  test_sprintf<int>(&local_230,local_1e8,&value_local);
  pbVar3 = &local_210;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"os.str()",
             "test_sprintf(fmt::format(\"%{}i\", length_spec), value)",pbVar3,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_210);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_230);
    std::operator<<((ostream *)(local_230._M_dataplus._M_p + 0x10),"format: ");
    fmt::v5::format<char[5],char_const*>
              (&local_210,(v5 *)"%{}i",(char (*) [5])&length_spec_local,(char **)pbVar3);
    std::operator<<((ostream *)(local_230._M_dataplus._M_p + 0x10),(string *)&local_210);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x143;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x143,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_210);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_230);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::stringbuf::str();
  fmt::v5::format<char[5],char_const*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"%{}i",(char (*) [5])&length_spec_local,(char **)pbVar3);
  format_00.data_._1_7_ = gtest_ar._1_7_;
  format_00.data_._0_1_ = gtest_ar.success_;
  format_00.size_ = (size_t)gtest_ar.message_.ptr_;
  make_positional_abi_cxx11_((string *)&local_1e8,format_00);
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_230,(v5 *)&local_1e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_local,
             (int *)pbVar3);
  pbVar3 = &local_210;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_1,"os.str()",
             "fmt::sprintf(make_positional(fmt::format(\"%{}i\", length_spec)), value)",pbVar3,
             &local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_210);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_210);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x143;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x143,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_230,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_230);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_210);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  pcVar5 = "";
  std::__cxx11::string::string((string *)&local_210,"",(allocator *)&local_230);
  std::__cxx11::stringbuf::str(local_188);
  std::__cxx11::string::~string((string *)&local_210);
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)&os);
  std::__cxx11::stringbuf::str();
  fmt::v5::format<char[5],char_const*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8,
             (v5 *)"%{}u",(char (*) [5])&length_spec_local,(char **)pbVar3);
  test_sprintf<int>(&local_230,local_1e8,&value_local);
  pbVar3 = &local_210;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"os.str()",
             "test_sprintf(fmt::format(\"%{}u\", length_spec), value)",pbVar3,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_210);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_230);
    std::operator<<((ostream *)(local_230._M_dataplus._M_p + 0x10),"format: ");
    fmt::v5::format<char[5],char_const*>
              (&local_210,(v5 *)"%{}u",(char (*) [5])&length_spec_local,(char **)pbVar3);
    std::operator<<((ostream *)(local_230._M_dataplus._M_p + 0x10),(string *)&local_210);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x146;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x146,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_210);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_230);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::stringbuf::str();
  fmt::v5::format<char[5],char_const*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"%{}u",(char (*) [5])&length_spec_local,(char **)pbVar3);
  format_01.data_._1_7_ = gtest_ar._1_7_;
  format_01.data_._0_1_ = gtest_ar.success_;
  format_01.size_ = (size_t)gtest_ar.message_.ptr_;
  make_positional_abi_cxx11_((string *)&local_1e8,format_01);
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_230,(v5 *)&local_1e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_local,
             (int *)pbVar3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_1,"os.str()",
             "fmt::sprintf(make_positional(fmt::format(\"%{}u\", length_spec)), value)",&local_210,
             &local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_210);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_210);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x146,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_230,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_230);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_210);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  pcVar5 = "";
  std::__cxx11::string::string((string *)&local_210,"",(allocator *)&local_230);
  std::__cxx11::stringbuf::str(local_188);
  std::__cxx11::string::~string((string *)&local_210);
  uVar2 = *(uint *)((long)auStack_178 + *(long *)(_os + -0x18)) & 0xffffffb5 | 0x40;
  ppcVar4 = (char **)(ulong)uVar2;
  *(uint *)((long)auStack_178 + *(long *)(_os + -0x18)) = uVar2;
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)&os);
  std::__cxx11::stringbuf::str();
  fmt::v5::format<char[5],char_const*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8,
             (v5 *)"%{}o",(char (*) [5])&length_spec_local,ppcVar4);
  test_sprintf<int>(&local_230,local_1e8,&value_local);
  pbVar3 = &local_210;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"os.str()",
             "test_sprintf(fmt::format(\"%{}o\", length_spec), value)",pbVar3,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_210);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_230);
    std::operator<<((ostream *)(local_230._M_dataplus._M_p + 0x10),"format: ");
    fmt::v5::format<char[5],char_const*>
              (&local_210,(v5 *)"%{}o",(char (*) [5])&length_spec_local,(char **)pbVar3);
    std::operator<<((ostream *)(local_230._M_dataplus._M_p + 0x10),(string *)&local_210);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x149;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x149,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_210);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_230);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::stringbuf::str();
  fmt::v5::format<char[5],char_const*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"%{}o",(char (*) [5])&length_spec_local,(char **)pbVar3);
  format_02.data_._1_7_ = gtest_ar._1_7_;
  format_02.data_._0_1_ = gtest_ar.success_;
  format_02.size_ = (size_t)gtest_ar.message_.ptr_;
  make_positional_abi_cxx11_((string *)&local_1e8,format_02);
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_230,(v5 *)&local_1e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_local,
             (int *)pbVar3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_1,"os.str()",
             "fmt::sprintf(make_positional(fmt::format(\"%{}o\", length_spec)), value)",&local_210,
             &local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_210);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_210);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x149,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_230,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_230);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_210);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  pcVar5 = "";
  std::__cxx11::string::string((string *)&local_210,"",(allocator *)&local_230);
  std::__cxx11::stringbuf::str(local_188);
  std::__cxx11::string::~string((string *)&local_210);
  uVar2 = *(uint *)((long)auStack_178 + *(long *)(_os + -0x18)) & 0xffffffb5 | 8;
  ppcVar4 = (char **)(ulong)uVar2;
  *(uint *)((long)auStack_178 + *(long *)(_os + -0x18)) = uVar2;
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)&os);
  std::__cxx11::stringbuf::str();
  fmt::v5::format<char[5],char_const*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8,
             (v5 *)"%{}x",(char (*) [5])&length_spec_local,ppcVar4);
  test_sprintf<int>(&local_230,local_1e8,&value_local);
  pbVar3 = &local_210;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"os.str()",
             "test_sprintf(fmt::format(\"%{}x\", length_spec), value)",pbVar3,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_210);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_230);
    std::operator<<((ostream *)(local_230._M_dataplus._M_p + 0x10),"format: ");
    fmt::v5::format<char[5],char_const*>
              (&local_210,(v5 *)"%{}x",(char (*) [5])&length_spec_local,(char **)pbVar3);
    std::operator<<((ostream *)(local_230._M_dataplus._M_p + 0x10),(string *)&local_210);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14c;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x14c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_210);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_230);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::stringbuf::str();
  fmt::v5::format<char[5],char_const*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"%{}x",(char (*) [5])&length_spec_local,(char **)pbVar3);
  format_03.data_._1_7_ = gtest_ar._1_7_;
  format_03.data_._0_1_ = gtest_ar.success_;
  format_03.size_ = (size_t)gtest_ar.message_.ptr_;
  make_positional_abi_cxx11_((string *)&local_1e8,format_03);
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_230,(v5 *)&local_1e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_local,
             (int *)pbVar3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_1,"os.str()",
             "fmt::sprintf(make_positional(fmt::format(\"%{}x\", length_spec)), value)",&local_210,
             &local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_210);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_210);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x14c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_230,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_230);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_210);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  pcVar5 = "";
  std::__cxx11::string::string((string *)&local_210,"",(allocator *)&local_230);
  std::__cxx11::stringbuf::str(local_188);
  std::__cxx11::string::~string((string *)&local_210);
  ppcVar4 = *(char ***)(_os + -0x18);
  *(uint *)((long)auStack_178 + (long)ppcVar4) =
       *(uint *)((long)auStack_178 + (long)ppcVar4) & 0xffffffb5 | 8;
  puVar1 = (uint *)((long)auStack_178 + *(long *)(_os + -0x18));
  *puVar1 = *puVar1 | 0x4000;
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)&os);
  std::__cxx11::stringbuf::str();
  fmt::v5::format<char[5],char_const*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8,
             (v5 *)"%{}X",(char (*) [5])&length_spec_local,ppcVar4);
  test_sprintf<int>(&local_230,local_1e8,&value_local);
  pbVar3 = &local_210;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"os.str()",
             "test_sprintf(fmt::format(\"%{}X\", length_spec), value)",pbVar3,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_210);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_230);
    std::operator<<((ostream *)(local_230._M_dataplus._M_p + 0x10),"format: ");
    fmt::v5::format<char[5],char_const*>
              (&local_210,(v5 *)"%{}X",(char (*) [5])&length_spec_local,(char **)pbVar3);
    std::operator<<((ostream *)(local_230._M_dataplus._M_p + 0x10),(string *)&local_210);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14f;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x14f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_210);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_230);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::stringbuf::str();
  fmt::v5::format<char[5],char_const*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"%{}X",(char (*) [5])&length_spec_local,(char **)pbVar3);
  format_04.data_._1_7_ = gtest_ar._1_7_;
  format_04.data_._0_1_ = gtest_ar.success_;
  format_04.size_ = (size_t)gtest_ar.message_.ptr_;
  make_positional_abi_cxx11_((string *)&local_1e8,format_04);
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_230,(v5 *)&local_1e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_local,
             (int *)pbVar3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_1,"os.str()",
             "fmt::sprintf(make_positional(fmt::format(\"%{}X\", length_spec)), value)",&local_210,
             &local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_210);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_210);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x14f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_230,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_230);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_210);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  return;
}

Assistant:

void TestLength(const char *length_spec, U value) {
  long long signed_value = 0;
  unsigned long long unsigned_value = 0;
  // Apply integer promotion to the argument.
  using std::numeric_limits;
  unsigned long long max = numeric_limits<U>::max();
  using fmt::internal::const_check;
  if (const_check(max <= static_cast<unsigned>(numeric_limits<int>::max()))) {
    signed_value = static_cast<int>(value);
    unsigned_value = static_cast<unsigned>(value);
  } else if (const_check(max <= numeric_limits<unsigned>::max())) {
    signed_value = static_cast<unsigned>(value);
    unsigned_value = static_cast<unsigned>(value);
  }
  if (sizeof(U) <= sizeof(int) && sizeof(int) < sizeof(T)) {
    signed_value = static_cast<long long>(value);
    unsigned_value =
        static_cast<typename std::make_unsigned<unsigned>::type>(value);
  } else {
    signed_value = static_cast<typename make_signed<T>::type>(value);
    unsigned_value = static_cast<typename std::make_unsigned<T>::type>(value);
  }
  std::ostringstream os;
  os << signed_value;
  EXPECT_PRINTF(os.str(), fmt::format("%{}d", length_spec), value);
  EXPECT_PRINTF(os.str(), fmt::format("%{}i", length_spec), value);
  os.str("");
  os << unsigned_value;
  EXPECT_PRINTF(os.str(), fmt::format("%{}u", length_spec), value);
  os.str("");
  os << std::oct << unsigned_value;
  EXPECT_PRINTF(os.str(), fmt::format("%{}o", length_spec), value);
  os.str("");
  os << std::hex << unsigned_value;
  EXPECT_PRINTF(os.str(), fmt::format("%{}x", length_spec), value);
  os.str("");
  os << std::hex << std::uppercase << unsigned_value;
  EXPECT_PRINTF(os.str(), fmt::format("%{}X", length_spec), value);
}